

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O2

int blake2sp_init_leaf(blake2s_state *S,size_t outlen,size_t keylen,uint32_t offset)

{
  int iVar1;
  blake2s_param local_38;
  
  local_38.key_length = (uint8_t)keylen;
  local_38.digest_length = (uint8_t)outlen;
  local_38.fanout = '\b';
  local_38.depth = '\x02';
  local_38.leaf_length = 0;
  local_38.node_offset._0_1_ = (undefined1)offset;
  local_38._9_4_ = 0;
  local_38._13_2_ = 0;
  local_38.inner_length = 0x20;
  local_38.salt[0] = '\0';
  local_38.salt[1] = '\0';
  local_38.salt[2] = '\0';
  local_38.salt[3] = '\0';
  local_38.salt[4] = '\0';
  local_38.salt[5] = '\0';
  local_38.salt[6] = '\0';
  local_38.salt[7] = '\0';
  local_38.personal[0] = '\0';
  local_38.personal[1] = '\0';
  local_38.personal[2] = '\0';
  local_38.personal[3] = '\0';
  local_38.personal[4] = '\0';
  local_38.personal[5] = '\0';
  local_38.personal[6] = '\0';
  local_38.personal[7] = '\0';
  iVar1 = blake2s_init_param(S,&local_38);
  S->outlen = (ulong)local_38.inner_length;
  return iVar1;
}

Assistant:

static int blake2sp_init_leaf( blake2s_state *S, size_t outlen, size_t keylen, uint32_t offset )
{
  blake2s_param P[1];
  P->digest_length = (uint8_t)outlen;
  P->key_length = (uint8_t)keylen;
  P->fanout = PARALLELISM_DEGREE;
  P->depth = 2;
  store32( &P->leaf_length, 0 );
  store32( &P->node_offset, offset );
  store16( &P->xof_length, 0 );
  P->node_depth = 0;
  P->inner_length = BLAKE2S_OUTBYTES;
  memset( P->salt, 0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );
  return blake2sp_init_leaf_param( S, P );
}